

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMPCG.cpp
# Opt level: O2

void __thiscall phaeton::OMPCG::visitContractionExpr(OMPCG *this,ContractionExpr *ContrExpr)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  uint uVar1;
  ExpressionNode *Node;
  pointer piVar2;
  ExpressionNode *Node_00;
  ExpressionNode *Node_01;
  ExpressionNode *pEVar3;
  ExpressionNode *pEVar4;
  int I_2;
  long lVar5;
  int iVar6;
  int I;
  ulong uVar7;
  int I_1;
  string Index;
  string local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ContrIndices;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  RHSIndices;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  LHSIndices;
  string Tmp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  SavedExprIndices;
  string RHSTmp;
  string LHSTmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((ContrExpr->super_ExpressionNode).NumChildren == 2) {
    Node = this->ResultTmp;
    LHSTmp._M_dataplus._M_p = (pointer)&LHSTmp.field_2;
    LHSTmp._M_string_length = 0;
    LHSTmp.field_2._M_local_buf[0] = '\0';
    RHSTmp._M_dataplus._M_p = (pointer)&RHSTmp.field_2;
    RHSTmp._M_string_length = 0;
    RHSTmp.field_2._M_local_buf[0] = '\0';
    getTmp_abi_cxx11_(&Tmp,this);
    Node_00 = ExpressionNode::getChild(&ContrExpr->super_ExpressionNode,0);
    Node_01 = ExpressionNode::getChild(&ContrExpr->super_ExpressionNode,1);
    pEVar3 = ExpressionNode::getChild(&ContrExpr->super_ExpressionNode,0);
    pEVar4 = ExpressionNode::getChild(&ContrExpr->super_ExpressionNode,1);
    ContrIndices.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ContrIndices.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ContrIndices.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (uVar7 = 0;
        uVar7 < (ulong)((long)(ContrExpr->LeftIndices).super__Vector_base<int,_std::allocator<int>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(ContrExpr->LeftIndices).super__Vector_base<int,_std::allocator<int>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2); uVar7 = uVar7 + 1) {
      getIndex_abi_cxx11_(&local_1c8,this);
      std::operator+(&Index,&local_1c8,"_contr");
      std::__cxx11::string::~string((string *)&local_1c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&ContrIndices,&Index);
      std::__cxx11::string::~string((string *)&Index);
    }
    LHSIndices.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    RHSIndices.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LHSIndices.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    LHSIndices.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    RHSIndices.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    RHSIndices.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __x = &this->ExprIndices;
    iVar6 = 0;
    for (uVar7 = 0;
        uVar7 < (ulong)((long)(pEVar3->Dims).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(pEVar3->Dims).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2); uVar7 = uVar7 + 1) {
      Index._M_dataplus._M_p = (pointer)&Index.field_2;
      Index._M_string_length = 0;
      Index.field_2._M_local_buf[0] = '\0';
      piVar2 = (ContrExpr->LeftIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (((ulong)(long)iVar6 <
           (ulong)((long)(ContrExpr->LeftIndices).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2)) &&
         (uVar7 == (uint)piVar2[iVar6])) {
        std::__cxx11::string::_M_assign((string *)&Index);
        iVar6 = iVar6 + 1;
      }
      else {
        std::__cxx11::string::_M_assign((string *)&Index);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&LHSIndices,&Index);
      std::__cxx11::string::~string((string *)&Index);
    }
    iVar6 = 0;
    for (uVar7 = 0;
        uVar7 < (ulong)((long)(pEVar4->Dims).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(pEVar4->Dims).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2); uVar7 = uVar7 + 1) {
      Index._M_dataplus._M_p = (pointer)&Index.field_2;
      Index._M_string_length = 0;
      Index.field_2._M_local_buf[0] = '\0';
      piVar2 = (ContrExpr->RightIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (((ulong)(long)iVar6 <
           (ulong)((long)(ContrExpr->RightIndices).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2)) &&
         (uVar7 == (uint)piVar2[iVar6])) {
        std::__cxx11::string::_M_assign((string *)&Index);
        iVar6 = iVar6 + 1;
      }
      else {
        std::__cxx11::string::_M_assign((string *)&Index);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&RHSIndices,&Index);
      std::__cxx11::string::~string((string *)&Index);
    }
    emitLoopHeaderNest(this,&(ContrExpr->super_ExpressionNode).Dims,false,true);
    Index._M_dataplus._M_p = (pointer)&Index.field_2;
    std::__cxx11::string::_M_construct((ulong)&Index,(char)this->NestLevel * '\x02');
    appendCode(this,&Index);
    std::__cxx11::string::~string((string *)&Index);
    std::operator+(&local_188,&this->FloatPointTypeName," ");
    std::operator+(&local_1c8,&local_188,&Tmp);
    std::operator+(&Index,&local_1c8," = 0.0;\n");
    appendCode(this,&Index);
    std::__cxx11::string::~string((string *)&Index);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_188);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&SavedExprIndices,__x);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(__x,&LHSIndices);
    visitChildExpr_abi_cxx11_(&Index,this,Node_00);
    std::__cxx11::string::operator=((string *)&LHSTmp,(string *)&Index);
    std::__cxx11::string::~string((string *)&Index);
    emitLoopHeaderNest(this,&pEVar3->Dims,false,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(__x,&RHSIndices);
    visitChildExpr_abi_cxx11_(&Index,this,Node_01);
    std::__cxx11::string::operator=((string *)&RHSTmp,(string *)&Index);
    std::__cxx11::string::~string((string *)&Index);
    emitLoopHeaderNest(this,&pEVar4->Dims,false,false);
    Index._M_dataplus._M_p = (pointer)&Index.field_2;
    std::__cxx11::string::_M_construct((ulong)&Index,(char)this->NestLevel * '\x02');
    appendCode(this,&Index);
    std::__cxx11::string::~string((string *)&Index);
    std::operator+(&local_50,&Tmp," += ");
    std::operator+(&local_108,&local_50,&LHSTmp);
    std::operator+(&local_188,&local_108," * ");
    std::operator+(&local_1c8,&local_188,&RHSTmp);
    std::operator+(&Index,&local_1c8,";\n");
    appendCode(this,&Index);
    std::__cxx11::string::~string((string *)&Index);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_50);
    for (uVar7 = 0;
        uVar7 < (ulong)((long)ContrIndices.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)ContrIndices.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1) {
      uVar1 = this->NestLevel;
      this->NestLevel = uVar1 - 1;
      emitForLoopFooter(this,uVar1 * 2 - 2);
    }
    Index._M_dataplus._M_p = (pointer)&Index.field_2;
    std::__cxx11::string::_M_construct((ulong)&Index,(char)this->NestLevel * '\x02');
    appendCode(this,&Index);
    std::__cxx11::string::~string((string *)&Index);
    subscriptedIdentifier(&local_108,this,Node,&this->ResultIndices);
    std::operator+(&local_188,&local_108," = ");
    std::operator+(&local_1c8,&local_188,&Tmp);
    std::operator+(&Index,&local_1c8,";\n");
    appendCode(this,&Index);
    std::__cxx11::string::~string((string *)&Index);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_108);
    lVar5 = 0;
    for (uVar7 = 0;
        uVar7 < (ulong)((long)ContrIndices.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)ContrIndices.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(&(this->LoopedOverIndices)._M_t,
              (key_type *)
              ((long)&((ContrIndices.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5));
      lVar5 = lVar5 + 0x20;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(__x,&SavedExprIndices);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&SavedExprIndices);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&RHSIndices);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&LHSIndices);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ContrIndices);
    std::__cxx11::string::~string((string *)&Tmp);
    std::__cxx11::string::~string((string *)&RHSTmp);
    std::__cxx11::string::~string((string *)&LHSTmp);
    return;
  }
  __assert_fail("ContrExpr->getNumChildren() == 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lijiansong[P]Phaeton/lib/Target/OMPCG.cpp"
                ,0x324,"virtual void phaeton::OMPCG::visitContractionExpr(const ContractionExpr *)")
  ;
}

Assistant:

void OMPCG::visitContractionExpr(const ContractionExpr *ContrExpr) {
  assert(ContrExpr->getNumChildren() == 2);

  const ExpressionNode *Result = getResultTmp();
  std::string LHSTmp, RHSTmp;
  const std::string Tmp = getTmp();

  // Here 'LHS' and 'RHS' for contraction expression means its two operand.
  const ExpressionNode *LHSExpr = ContrExpr->getChild(0);
  const ExpressionNode *RHSExpr = ContrExpr->getChild(1);

  const std::vector<int> &ExprDims = getDims(ContrExpr);
  const std::vector<int> &LHSDims = getDims(ContrExpr->getChild(0));
  const std::vector<int> &RHSDims = getDims(ContrExpr->getChild(1));

  std::vector<std::string> ContrIndices;
  for (int I = 0; I < ContrExpr->getLeftIndices().size(); ++I) {
    const std::string &Index = getIndex() + "_contr";
    ContrIndices.push_back(Index);
  }

  std::vector<std::string> LHSIndices, RHSIndices;
  int ExprIndexCounter = 0;
  // Here we need to determine which indices belong to 'LHS', i.e. the first
  // operand.
  {
    int ContrIndexCounter = 0;
    for (int I = 0; I < LHSDims.size(); ++I) {
      std::string Index;
      if (ContrIndexCounter < ContrExpr->getLeftIndices().size() &&
          I == ContrExpr->getLeftIndices()[ContrIndexCounter]) {
        Index = ContrIndices[ContrIndexCounter++];
      } else {
        Index = ExprIndices[ExprIndexCounter++];
      }
      LHSIndices.push_back(Index);
    }
  }
  // Here we need to determine which indices belong to 'RHS', i.e. the second
  // operand.
  {
    int ContrIndexCounter = 0;
    for (int I = 0; I < RHSDims.size(); ++I) {
      std::string Index;
      if (ContrIndexCounter < ContrExpr->getRightIndices().size() &&
          I == ContrExpr->getRightIndices()[ContrIndexCounter]) {
        Index = ContrIndices[ContrIndexCounter++];
      } else {
        Index = ExprIndices[ExprIndexCounter++];
      }
      RHSIndices.push_back(Index);
    }
  }

  // Here we need to emit for loop nest for result.
  emitLoopHeaderNest(ExprDims, /*Unroll=*/false, /*Simd=*/true);

  OMP_CG_INDENT(NestLevel * OMP_INDENT_PER_LEVEL);
  // FIXME: for different we need to determine the zero format for different
  // kind float point numbers.
  appendCode(getFloatPointTypeName() + " " + Tmp + " = 0.0;\n");

  const std::vector<std::string> SavedExprIndices = ExprIndices;
  // Here we visit 'LHS'.
  ExprIndices = LHSIndices;
  LHSTmp = visitChildExpr(LHSExpr);
  // Here we emit for loop nest for 'LHS' early.
  emitLoopHeaderNest(LHSDims, /*Unroll=*/false, /*Simd=*/false);
  // Here we visit 'RHS' and emit loop headers as necessary.
  ExprIndices = RHSIndices;
  RHSTmp = visitChildExpr(RHSExpr);
  // Here we emit for loop nest for 'RHS'.
  emitLoopHeaderNest(RHSDims, /*Unroll=*/false, /*Simd=*/false);

  OMP_CG_INDENT(NestLevel * OMP_INDENT_PER_LEVEL);
  appendCode(Tmp + " += " + LHSTmp + " * " + RHSTmp + ";\n");

  // 1. We need to close those for loops that iterate over those contracted
  // indices.
  for (int I = 0; I < ContrIndices.size(); ++I) {
    --NestLevel;
    emitForLoopFooter(NestLevel * OMP_INDENT_PER_LEVEL);
  }

  OMP_CG_INDENT(NestLevel * OMP_INDENT_PER_LEVEL);
  appendCode(subscriptedIdentifier(Result, ResultIndices) + " = " + Tmp +
             ";\n");

  // 2. Then we need to remove contracted indices from 'LoopedOverIndices'.
  for (int I = 0; I < ContrIndices.size(); ++I) {
    LoopedOverIndices.erase(ContrIndices[I]);
  }

  ExprIndices = SavedExprIndices;
}